

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

float __thiscall TransferFunctionITU::encode(TransferFunctionITU *this,float intensity)

{
  float fVar1;
  
  if (intensity < this->linearCutoff_) {
    return intensity * this->linearExpansion_;
  }
  fVar1 = powf(intensity,this->oeGamma_);
  return fVar1 * 1.099 + -0.099;
}

Assistant:

float encode(const float intensity) const override {
        float brightness;

        if (intensity < linearCutoff_)
            brightness = intensity * linearExpansion_;
        else
            brightness = 1.099f * pow(intensity, oeGamma_) - 0.099f;

        return brightness;
    }